

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_lazy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  seqDef *psVar3;
  bool bVar4;
  char cVar5;
  undefined8 uVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  BYTE *pBVar11;
  uint uVar12;
  uint uVar13;
  BYTE *pBVar14;
  U32 UVar15;
  U32 UVar16;
  char *pcVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  U32 UVar24;
  int iVar25;
  int *piVar26;
  BYTE *pBVar27;
  long lVar28;
  int *ip;
  size_t ofbCandidate;
  BYTE *litEnd;
  U32 maxDistance;
  BYTE *litLimit_w;
  size_t local_108;
  uint local_fc;
  BYTE *local_f8;
  BYTE *local_f0;
  uint local_e4;
  seqStore_t *local_e0;
  int *local_d8;
  ulong local_d0;
  int *local_c8;
  ulong local_c0;
  uint local_b4;
  int local_b0;
  U32 local_ac;
  ulong local_a8;
  ulong local_a0;
  BYTE *local_98;
  int *local_90;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  int *local_70;
  U32 *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_f0 = (ms->window).base;
  local_98 = (ms->window).dictBase;
  uVar13 = (ms->window).dictLimit;
  local_d0 = (ulong)uVar13;
  local_e4 = (ms->cParams).minMatch;
  if (5 < local_e4) {
    local_e4 = 6;
  }
  if (local_e4 < 5) {
    local_e4 = 4;
  }
  local_b4 = (ms->cParams).searchLog;
  local_fc = 6;
  if (local_b4 < 6) {
    local_fc = local_b4;
  }
  uVar20 = (ms->window).lowLimit;
  if (local_fc < 5) {
    local_fc = 4;
  }
  uVar19 = (ms->cParams).windowLog;
  uVar10 = (ulong)*rep;
  UVar24 = rep[1];
  ms->lazySkipping = 0;
  local_88 = local_f0 + local_d0;
  piVar26 = (int *)((ulong)(local_88 == (BYTE *)src) + (long)src);
  local_90 = (int *)((long)src + (srcSize - 0x10));
  uVar2 = ms->nextToUpdate;
  uVar21 = (ulong)uVar2;
  uVar22 = ((int)local_90 - (int)(local_f0 + uVar21)) + 1;
  uVar12 = 8;
  if (uVar22 < 8) {
    uVar12 = uVar22;
  }
  if (local_90 < local_f0 + uVar21) {
    uVar12 = 0;
  }
  if (uVar2 < uVar12 + uVar2) {
    uVar9 = ms->hashSalt;
    cVar5 = (char)ms->rowHashLog;
    do {
      if (local_e4 == 5) {
        uVar18 = *(long *)(local_f0 + uVar21) * -0x30e4432345000000;
LAB_0036b16f:
        uVar22 = (uint)((uVar18 ^ uVar9) >> (0x38U - cVar5 & 0x3f));
      }
      else {
        if (local_e4 == 6) {
          uVar18 = *(long *)(local_f0 + uVar21) * -0x30e4432340650000;
          goto LAB_0036b16f;
        }
        uVar22 = (*(int *)(local_f0 + uVar21) * -0x61c8864f ^ (uint)uVar9) >> (0x18U - cVar5 & 0x1f)
        ;
      }
      ms->hashCache[(uint)uVar21 & 7] = uVar22;
      uVar21 = uVar21 + 1;
    } while (uVar12 + uVar2 != uVar21);
  }
  pBVar27 = (BYTE *)(srcSize + (long)src);
  local_d8 = (int *)src;
  local_68 = rep;
  if (piVar26 < local_90) {
    local_80 = local_98 + local_d0;
    local_78 = local_98 + uVar20;
    uVar20 = 1 << ((byte)uVar19 & 0x1f);
    local_a0 = (ulong)uVar20;
    iVar23 = uVar13 - 1;
    local_70 = (int *)(pBVar27 + -0x20);
    iVar7 = (int)local_f0;
    local_58 = (ulong)(1 - (uVar20 + iVar7));
    local_50 = (ulong)(1 - iVar7);
    local_60 = (ulong)((uVar13 + iVar7) - 2);
    local_f8 = pBVar27;
    local_e0 = seqStore;
    local_b0 = iVar23;
    do {
      iVar25 = (int)piVar26;
      iVar7 = (iVar25 - (int)local_f0) + 1;
      UVar16 = (ms->window).lowLimit;
      UVar15 = iVar7 - (uint)local_a0;
      if (iVar7 - UVar16 <= (uint)local_a0) {
        UVar15 = UVar16;
      }
      if (ms->loadedDictEnd != 0) {
        UVar15 = UVar16;
      }
      uVar20 = (uint)uVar10;
      uVar13 = iVar7 - uVar20;
      pBVar14 = local_f0;
      if (uVar13 < (uint)local_d0) {
        pBVar14 = local_98;
      }
      local_ac = UVar24;
      if (iVar23 - uVar13 < 3) {
LAB_0036b322:
        uVar21 = 0;
      }
      else {
        uVar21 = 0;
        if (uVar20 <= iVar7 - UVar15) {
          if (*(int *)((long)piVar26 + 1) != *(int *)(pBVar14 + uVar13)) goto LAB_0036b322;
          pBVar11 = pBVar27;
          if (uVar13 < (uint)local_d0) {
            pBVar11 = local_80;
          }
          sVar8 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar26 + 5),(BYTE *)((long)(pBVar14 + uVar13) + 4),
                             pBVar27,pBVar11,local_88);
          uVar21 = sVar8 + 4;
        }
      }
      local_108 = 999999999;
      if (local_e4 == 6) {
        if (local_fc == 6) {
          uVar9 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)piVar26,pBVar27,&local_108);
        }
        else if (local_fc == 5) {
          uVar9 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)piVar26,pBVar27,&local_108);
        }
        else {
          uVar9 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)piVar26,pBVar27,&local_108);
        }
      }
      else if (local_e4 == 5) {
        if (local_fc == 6) {
          uVar9 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)piVar26,pBVar27,&local_108);
        }
        else if (local_fc == 5) {
          uVar9 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)piVar26,pBVar27,&local_108);
        }
        else {
          uVar9 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)piVar26,pBVar27,&local_108);
        }
      }
      else if (local_fc == 6) {
        uVar9 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)piVar26,pBVar27,&local_108);
      }
      else if (local_fc == 5) {
        uVar9 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)piVar26,pBVar27,&local_108);
      }
      else {
        uVar9 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)piVar26,pBVar27,&local_108);
      }
      local_c0 = uVar21;
      if (uVar21 < uVar9) {
        local_c0 = uVar9;
      }
      if (local_c0 < 4) {
        uVar21 = (long)piVar26 - (long)local_d8;
        piVar26 = (int *)((long)piVar26 + (uVar21 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar21);
        iVar23 = local_b0;
        UVar24 = local_ac;
      }
      else {
        local_c8 = piVar26;
        uVar18 = local_108;
        if (uVar9 <= uVar21) {
          local_c8 = (int *)((long)piVar26 + 1);
          uVar18 = 1;
        }
        local_38 = (ulong)(uint)((int)local_58 + iVar25);
        uVar13 = (int)local_50 + iVar25;
        local_40 = (ulong)uVar13;
        uVar19 = ((int)local_60 + uVar20) - iVar25;
        local_48 = (ulong)(uVar13 - uVar20);
        lVar28 = 0;
        local_a8 = uVar10;
        do {
          if (local_90 <= (int *)((long)piVar26 + lVar28)) break;
          ip = (int *)((long)piVar26 + lVar28 + 1);
          if (uVar18 == 0) {
            uVar18 = 0;
          }
          else {
            UVar24 = (ms->window).lowLimit;
            iVar23 = (int)lVar28;
            iVar7 = (int)local_40 + iVar23;
            UVar16 = (int)local_38 + iVar23;
            if (iVar7 - UVar24 <= (uint)local_a0) {
              UVar16 = UVar24;
            }
            if (ms->loadedDictEnd != 0) {
              UVar16 = UVar24;
            }
            uVar13 = (int)local_48 + iVar23;
            pBVar27 = local_f0;
            if (uVar13 < (uint)local_d0) {
              pBVar27 = local_98;
            }
            if (((2 < uVar19) && ((uint)local_a8 <= iVar7 - UVar16)) &&
               (*ip == *(int *)(pBVar27 + uVar13))) {
              pBVar14 = local_f8;
              if (uVar13 < (uint)local_d0) {
                pBVar14 = local_80;
              }
              sVar8 = ZSTD_count_2segments
                                ((BYTE *)((long)piVar26 + lVar28 + 5),
                                 (BYTE *)((long)(pBVar27 + uVar13) + 4),local_f8,pBVar14,local_88);
              if (sVar8 < 0xfffffffffffffffc) {
                uVar13 = 0x1f;
                if ((uint)uVar18 != 0) {
                  for (; (uint)uVar18 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                  }
                }
                if ((int)((uVar13 ^ 0x1f) + (int)local_c0 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
                  uVar18 = 1;
                  local_c8 = ip;
                  local_c0 = sVar8 + 4;
                }
              }
            }
          }
          local_108 = 999999999;
          if (local_e4 == 6) {
            if (local_fc == 6) {
              uVar10 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)ip,local_f8,&local_108);
            }
            else if (local_fc == 5) {
              uVar10 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)ip,local_f8,&local_108);
            }
            else {
              uVar10 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)ip,local_f8,&local_108);
            }
          }
          else if (local_e4 == 5) {
            if (local_fc == 6) {
              uVar10 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)ip,local_f8,&local_108);
            }
            else if (local_fc == 5) {
              uVar10 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)ip,local_f8,&local_108);
            }
            else {
              uVar10 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)ip,local_f8,&local_108);
            }
          }
          else if (local_fc == 6) {
            uVar10 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)ip,local_f8,&local_108);
          }
          else if (local_fc == 5) {
            uVar10 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)ip,local_f8,&local_108);
          }
          else {
            uVar10 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)ip,local_f8,&local_108);
          }
          bVar4 = true;
          if (3 < uVar10) {
            uVar13 = 0x1f;
            if ((uint)uVar18 != 0) {
              for (; (uint)uVar18 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            iVar7 = 0x1f;
            if ((uint)local_108 != 0) {
              for (; (uint)local_108 >> iVar7 == 0; iVar7 = iVar7 + -1) {
              }
            }
            if ((int)((uVar13 ^ 0x1f) + (int)local_c0 * 4 + -0x1b) < (int)uVar10 * 4 - iVar7) {
              bVar4 = false;
              uVar18 = local_108;
              local_c8 = ip;
              local_c0 = uVar10;
            }
          }
          lVar28 = lVar28 + 1;
          uVar19 = uVar19 - 1;
        } while (!bVar4);
        uVar13 = local_e4;
        pBVar27 = local_f8;
        if (uVar18 < 4) {
          uVar21 = (ulong)local_ac;
        }
        else {
          pcVar17 = (char *)((long)local_c8 + (3 - (long)(local_f0 + uVar18)));
          pBVar11 = local_88;
          pBVar14 = local_f0;
          if ((uint)pcVar17 < (uint)local_d0) {
            pBVar11 = local_78;
            pBVar14 = local_98;
          }
          if ((local_d8 < local_c8) &&
             (uVar10 = (ulong)pcVar17 & 0xffffffff, pBVar11 < pBVar14 + uVar10)) {
            pBVar14 = pBVar14 + uVar10;
            do {
              piVar26 = (int *)((long)local_c8 + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar26 != *pBVar14) ||
                 (local_c0 = local_c0 + 1, local_c8 = piVar26, piVar26 <= local_d8)) break;
            } while (pBVar11 < pBVar14);
          }
          uVar21 = local_a8 & 0xffffffff;
          local_a8 = (ulong)((U32)uVar18 - 3);
        }
        uVar10 = (long)local_c8 - (long)local_d8;
        if (local_70 < local_c8) {
          ZSTD_safecopyLiterals(local_e0->lit,(BYTE *)local_d8,(BYTE *)local_c8,(BYTE *)local_70);
        }
        else {
          pBVar14 = local_e0->lit;
          uVar6 = *(undefined8 *)(local_d8 + 2);
          *(undefined8 *)pBVar14 = *(undefined8 *)local_d8;
          *(undefined8 *)(pBVar14 + 8) = uVar6;
          if (0x10 < uVar10) {
            pBVar14 = local_e0->lit;
            uVar6 = *(undefined8 *)(local_d8 + 6);
            *(undefined8 *)(pBVar14 + 0x10) = *(undefined8 *)(local_d8 + 4);
            *(undefined8 *)(pBVar14 + 0x18) = uVar6;
            if (0x20 < (long)uVar10) {
              lVar28 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_d8 + lVar28 + 0x20);
                uVar6 = puVar1[1];
                pBVar11 = pBVar14 + lVar28 + 0x20;
                *(undefined8 *)pBVar11 = *puVar1;
                *(undefined8 *)(pBVar11 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)local_d8 + lVar28 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar11 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar11 + 0x18) = uVar6;
                lVar28 = lVar28 + 0x20;
              } while (pBVar11 + 0x20 < pBVar14 + uVar10);
            }
          }
        }
        local_e0->lit = local_e0->lit + uVar10;
        if (0xffff < uVar10) {
          local_e0->longLengthType = ZSTD_llt_literalLength;
          local_e0->longLengthPos =
               (U32)((ulong)((long)local_e0->sequences - (long)local_e0->sequencesStart) >> 3);
        }
        psVar3 = local_e0->sequences;
        psVar3->litLength = (U16)uVar10;
        psVar3->offBase = (U32)uVar18;
        if (0xffff < local_c0 - 3) {
          local_e0->longLengthType = ZSTD_llt_matchLength;
          local_e0->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_e0->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)(local_c0 - 3);
        local_e0->sequences = psVar3 + 1;
        if (ms->lazySkipping != 0) {
          uVar20 = ms->nextToUpdate;
          uVar10 = (ulong)uVar20;
          uVar19 = ((int)local_90 - (int)(local_f0 + uVar10)) + 1;
          if (7 < uVar19) {
            uVar19 = 8;
          }
          if (local_90 < local_f0 + uVar10) {
            uVar19 = 0;
          }
          if (uVar20 < uVar19 + uVar20) {
            uVar9 = ms->hashSalt;
            cVar5 = (char)ms->rowHashLog;
            do {
              if (uVar13 == 5) {
                uVar18 = *(long *)(local_f0 + uVar10) * -0x30e4432345000000;
LAB_0036b8eb:
                UVar24 = (U32)((uVar18 ^ uVar9) >> (0x38U - cVar5 & 0x3f));
              }
              else {
                if (uVar13 == 6) {
                  uVar18 = *(long *)(local_f0 + uVar10) * -0x30e4432340650000;
                  goto LAB_0036b8eb;
                }
                UVar24 = (*(int *)(local_f0 + uVar10) * -0x61c8864f ^ (uint)uVar9) >>
                         (0x18U - cVar5 & 0x1f);
              }
              ms->hashCache[(uint)uVar10 & 7] = UVar24;
              uVar10 = uVar10 + 1;
            } while (uVar19 + uVar20 != uVar10);
          }
          ms->lazySkipping = 0;
        }
        piVar26 = (int *)((long)local_c8 + local_c0);
        uVar10 = local_a8;
        iVar23 = local_b0;
        local_d8 = piVar26;
        do {
          UVar24 = (U32)uVar21;
          if (local_90 < piVar26) break;
          iVar7 = (int)piVar26 - (int)local_f0;
          UVar16 = (ms->window).lowLimit;
          UVar15 = iVar7 - (uint)local_a0;
          if (iVar7 - UVar16 <= (uint)local_a0) {
            UVar15 = UVar16;
          }
          if (ms->loadedDictEnd != 0) {
            UVar15 = UVar16;
          }
          uVar13 = iVar7 - UVar24;
          pBVar14 = local_f0;
          if (uVar13 < (uint)local_d0) {
            pBVar14 = local_98;
          }
          uVar20 = (uint)uVar10;
          if (((iVar23 - uVar13 < 3) || (iVar7 - UVar15 < UVar24)) ||
             (*piVar26 != *(int *)(pBVar14 + uVar13))) {
            bVar4 = false;
            uVar10 = uVar10 & 0xffffffff;
          }
          else {
            pBVar11 = pBVar27;
            if (uVar13 < (uint)local_d0) {
              pBVar11 = local_80;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)(piVar26 + 1),(BYTE *)((long)(pBVar14 + uVar13) + 4),pBVar27,
                               pBVar11,local_88);
            pBVar14 = local_e0->lit;
            if (local_70 < local_d8) {
              ZSTD_safecopyLiterals(pBVar14,(BYTE *)local_d8,(BYTE *)local_d8,(BYTE *)local_70);
            }
            else {
              uVar6 = *(undefined8 *)(local_d8 + 2);
              *(undefined8 *)pBVar14 = *(undefined8 *)local_d8;
              *(undefined8 *)(pBVar14 + 8) = uVar6;
            }
            psVar3 = local_e0->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if (0xffff < sVar8 + 1) {
              local_e0->longLengthType = ZSTD_llt_matchLength;
              local_e0->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)local_e0->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(sVar8 + 1);
            local_e0->sequences = psVar3 + 1;
            piVar26 = (int *)((long)piVar26 + sVar8 + 4);
            bVar4 = true;
            uVar10 = uVar21;
            iVar23 = local_b0;
            UVar24 = uVar20;
            local_d8 = piVar26;
          }
          uVar21 = (ulong)UVar24;
        } while (bVar4);
      }
    } while (piVar26 < local_90);
  }
  *local_68 = (U32)uVar10;
  local_68[1] = UVar24;
  return (long)pBVar27 - (long)local_d8;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 1);
}